

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeInitDrivers
          (uint32_t *pCount,ze_driver_handle_t *phDrivers,ze_init_driver_type_desc_t *desc)

{
  ze_result_t zVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  string driver_type;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  if (DAT_0010e168 == (code *)0x0) {
    pcVar3 = getenv("ZEL_TEST_NULL_DRIVER_TYPE");
    local_50 = &local_40;
    if (pcVar3 == (char *)0x0) {
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar3 + sVar4);
    }
    pcVar3 = local_50;
    iVar2 = strcmp(local_50,"GPU");
    if (((iVar2 == 0) && ((desc->flags & 1) == 0)) ||
       ((iVar2 = strcmp(pcVar3,"NPU"), iVar2 == 0 && ((desc->flags & 2) == 0)))) {
      if (pcVar3 != &local_40) {
        operator_delete(pcVar3,CONCAT71(uStack_3f,local_40) + 1);
      }
      zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      if (phDrivers == (ze_driver_handle_t *)0x0) {
        *pCount = 1;
      }
      else if (*pCount != 0) {
        uVar5 = 0;
        do {
          context_t::get()::count = context_t::get()::count + 1;
          phDrivers[uVar5] = context_t::get()::count;
          uVar5 = uVar5 + 1;
        } while (uVar5 < *pCount);
      }
      if (pcVar3 != &local_40) {
        operator_delete(pcVar3,CONCAT71(uStack_3f,local_40) + 1);
      }
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  zVar1 = (*DAT_0010e168)(pCount,phDrivers,desc);
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeInitDrivers(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of drivers available.
                                                        ///< if count is greater than the number of drivers available, then the
                                                        ///< loader shall update the value with the correct number of drivers available.
        ze_driver_handle_t* phDrivers,                  ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                        ///< if count is less than the number of drivers available, then the loader
                                                        ///< shall only retrieve that number of drivers.
        ze_init_driver_type_desc_t* desc                ///< [in] descriptor containing the driver type initialization details
                                                        ///< including ::ze_init_driver_type_flag_t combinations.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnInitDrivers = context.zeDdiTable.Global.pfnInitDrivers;
        if( nullptr != pfnInitDrivers )
        {
            result = pfnInitDrivers( pCount, phDrivers, desc );
        }
        else
        {
            // generic implementation
            auto driver_type = getenv_string( "ZEL_TEST_NULL_DRIVER_TYPE" );
            if (std::strcmp(driver_type.c_str(), "GPU") == 0) {
                if (!(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_GPU)) {
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
            }
            if (std::strcmp(driver_type.c_str(), "NPU") == 0) {
                if (!(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_NPU)) {
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
            }

            if (phDrivers == nullptr) {
                *pCount = 1;
            }
            for( size_t i = 0; ( nullptr != phDrivers ) && ( i < *pCount ); ++i )
                phDrivers[ i ] = reinterpret_cast<ze_driver_handle_t>( context.get() );

        }

        return result;
    }